

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.hpp
# Opt level: O3

void __thiscall
helics::InputInfo::InputInfo
          (InputInfo *this,GlobalHandle handle,string_view key_,string_view type_,string_view units_
          )

{
  this->id = handle;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->key,key_._M_str,key_._M_str + key_._M_len);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->type,type_._M_str,type_._M_str + type_._M_len);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->units,units_._M_str,units_._M_str + units_._M_len);
  this->required_connnections = 0;
  this->required = false;
  this->optional = false;
  this->has_target = false;
  this->only_update_on_change = false;
  this->only_update_on_change = false;
  this->not_interruptible = false;
  this->strict_type_matching = false;
  this->ignore_unit_mismatch = false;
  memset(&this->minTimeGap,0,0xb0);
  (this->inputUnits)._M_dataplus._M_p = (pointer)&(this->inputUnits).field_2;
  (this->inputUnits)._M_string_length = 0;
  (this->inputUnits).field_2._M_local_buf[0] = '\0';
  (this->inputType)._M_dataplus._M_p = (pointer)&(this->inputType).field_2;
  (this->inputType)._M_string_length = 0;
  (this->inputType).field_2._M_local_buf[0] = '\0';
  (this->sourceTargets)._M_dataplus._M_p = (pointer)&(this->sourceTargets).field_2;
  (this->sourceTargets)._M_string_length = 0;
  (this->sourceTargets).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputInfo(GlobalHandle handle,
              std::string_view key_,
              std::string_view type_,
              std::string_view units_): id(handle), key(key_), type(type_), units(units_)
    {
    }